

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDiscreteDynamicsWorld.cpp
# Opt level: O0

void __thiscall InplaceSolverIslandCallback::processConstraints(InplaceSolverIslandCallback *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long in_RDI;
  btTypedConstraint **constraints;
  btPersistentManifold **manifold;
  btCollisionObject **bodies;
  btPersistentManifold **fillData;
  long *plVar4;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  
  iVar1 = btAlignedObjectArray<btCollisionObject_*>::size
                    ((btAlignedObjectArray<btCollisionObject_*> *)(in_RDI + 0x38));
  if (iVar1 == 0) {
    local_58 = (btAlignedObjectArray<btPersistentManifold_*> *)0x0;
  }
  else {
    local_58 = (btAlignedObjectArray<btPersistentManifold_*> *)
               btAlignedObjectArray<btCollisionObject_*>::operator[]
                         ((btAlignedObjectArray<btCollisionObject_*> *)(in_RDI + 0x38),0);
  }
  iVar1 = btAlignedObjectArray<btPersistentManifold_*>::size
                    ((btAlignedObjectArray<btPersistentManifold_*> *)(in_RDI + 0x58));
  if (iVar1 == 0) {
    local_60 = (btPersistentManifold **)0x0;
  }
  else {
    local_60 = btAlignedObjectArray<btPersistentManifold_*>::operator[]
                         ((btAlignedObjectArray<btPersistentManifold_*> *)(in_RDI + 0x58),0);
  }
  iVar1 = btAlignedObjectArray<btTypedConstraint_*>::size
                    ((btAlignedObjectArray<btTypedConstraint_*> *)(in_RDI + 0x78));
  if (iVar1 == 0) {
    local_68 = (btTypedConstraint **)0x0;
  }
  else {
    local_68 = btAlignedObjectArray<btTypedConstraint_*>::operator[]
                         ((btAlignedObjectArray<btTypedConstraint_*> *)(in_RDI + 0x78),0);
  }
  plVar4 = *(long **)(in_RDI + 0x10);
  iVar1 = btAlignedObjectArray<btCollisionObject_*>::size
                    ((btAlignedObjectArray<btCollisionObject_*> *)(in_RDI + 0x38));
  iVar2 = btAlignedObjectArray<btPersistentManifold_*>::size
                    ((btAlignedObjectArray<btPersistentManifold_*> *)(in_RDI + 0x58));
  iVar3 = btAlignedObjectArray<btTypedConstraint_*>::size
                    ((btAlignedObjectArray<btTypedConstraint_*> *)(in_RDI + 0x78));
  fillData = *(btPersistentManifold ***)(in_RDI + 0x30);
  (**(code **)(*plVar4 + 0x18))
            (plVar4,local_58,iVar1,local_60,iVar2,local_68,iVar3,*(undefined8 *)(in_RDI + 8),
             *(undefined8 *)(in_RDI + 0x28));
  iVar1 = (int)((ulong)plVar4 >> 0x20);
  btAlignedObjectArray<btCollisionObject_*>::resize
            ((btAlignedObjectArray<btCollisionObject_*> *)local_58,iVar1,
             (btCollisionObject **)fillData);
  btAlignedObjectArray<btPersistentManifold_*>::resize(local_58,iVar1,fillData);
  btAlignedObjectArray<btTypedConstraint_*>::resize
            ((btAlignedObjectArray<btTypedConstraint_*> *)local_58,iVar1,
             (btTypedConstraint **)fillData);
  return;
}

Assistant:

void	processConstraints()
	{

		btCollisionObject** bodies = m_bodies.size()? &m_bodies[0]:0;
		btPersistentManifold** manifold = m_manifolds.size()?&m_manifolds[0]:0;
		btTypedConstraint** constraints = m_constraints.size()?&m_constraints[0]:0;

		m_solver->solveGroup( bodies,m_bodies.size(),manifold, m_manifolds.size(),constraints, m_constraints.size() ,*m_solverInfo,m_debugDrawer,m_dispatcher);
		m_bodies.resize(0);
		m_manifolds.resize(0);
		m_constraints.resize(0);

	}